

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

void __thiscall
llvm::raw_fd_ostream::raw_fd_ostream
          (raw_fd_ostream *this,StringRef Filename,error_code *EC,CreationDisposition Disp,
          FileAccess Access,OpenFlags Flags)

{
  int fd;
  
  fd = fileno(_stdout);
  raw_fd_ostream(this,fd,true,false);
  return;
}

Assistant:

raw_fd_ostream::raw_fd_ostream(StringRef Filename, std::error_code &EC,
                               sys::fs::CreationDisposition Disp,
                               sys::fs::FileAccess Access,
                               sys::fs::OpenFlags Flags)
    : raw_fd_ostream(getFD(Filename, EC, Disp, Access, Flags), true) {}